

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O3

size_t axl::err::pushError(ErrorRef *error)

{
  size_t sVar1;
  Error stack;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> BStack_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_30;
  
  sl::callOnce<axl::sl::ConstructSingleton<axl::err::ErrorMgr>,unsigned_char*>
            (sl::getSingleton<axl::err::ErrorMgr>(int*)::buffer,0);
  ErrorMgr::getLastError
            ((ErrorRef *)&local_30,(ErrorMgr *)sl::getSingleton<axl::err::ErrorMgr>(int*)::buffer);
  Error::Error((Error *)&BStack_48,(ErrorRef *)&local_30);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_30);
  sVar1 = Error::push((Error *)&BStack_48,error);
  if (sVar1 == 0xffffffffffffffff) {
    BStack_48.m_size = 0xffffffffffffffff;
  }
  else {
    sl::callOnce<axl::sl::ConstructSingleton<axl::err::ErrorMgr>,unsigned_char*>
              (sl::getSingleton<axl::err::ErrorMgr>(int*)::buffer,0);
    ErrorMgr::setError((ErrorMgr *)sl::getSingleton<axl::err::ErrorMgr>(int*)::buffer,
                       (ErrorRef *)&BStack_48);
  }
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&BStack_48);
  return BStack_48.m_size;
}

Assistant:

size_t
pushError(const ErrorRef& error) {
	Error stack = getLastError();
	size_t result = stack.push(error);
	return result != -1 ? setError(stack) : -1;
}